

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O1

IComponentManager * JHCOM::getComponentManager(void)

{
  ComponentManager *this;
  
  if (gManager == (IComponentManager *)0x0) {
    gMaster = 1;
    this = (ComponentManager *)
           operator_new(0x30,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                        ,0x112);
    ComponentManager::ComponentManager(this);
    gManager = (IComponentManager *)this;
  }
  return gManager;
}

Assistant:

IComponentManager *JHCOM::getComponentManager()
{
	if ( gManager == NULL )
	{
		gMaster = true;
		gManager = jh_new ComponentManager;
	}
	
	return gManager;
}